

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint64_t helper_neon_rshl_s64_arm(uint64_t valop,uint64_t shiftop)

{
  long lVar1;
  byte bVar2;
  
  bVar2 = (byte)shiftop;
  if ((int)(char)bVar2 - 0x40U < 0xffffff81) {
    return 0;
  }
  if (-1 < (char)bVar2) {
    return valop << (bVar2 & 0x3f);
  }
  lVar1 = (long)valop >> (~bVar2 & 0x3f);
  if (lVar1 == 0x7fffffffffffffff) {
    return 0x4000000000000000;
  }
  return lVar1 + 1 >> 1;
}

Assistant:

uint64_t HELPER(neon_rshl_s64)(uint64_t valop, uint64_t shiftop)
{
    int8_t shift = (int8_t)shiftop;
    int64_t val = valop;
    if ((shift >= 64) || (shift <= -64)) {
        val = 0;
    } else if (shift < 0) {
        val >>= (-shift - 1);
        if (val == INT64_MAX) {
            /* In this case, it means that the rounding constant is 1,
             * and the addition would overflow. Return the actual
             * result directly.  */
            val = 0x4000000000000000LL;
        } else {
            val++;
            val >>= 1;
        }
    } else {
        val <<= shift;
    }
    return val;
}